

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

CTcPrsNode * __thiscall
CTPNArglistBase::adjust_for_dyn(CTPNArglistBase *this,tcpn_dyncomp_info *info)

{
  undefined8 in_RSI;
  CTcPrsNode *in_RDI;
  CTPNArg *arg;
  CTPNArgBase *local_18;
  
  for (local_18 = (CTPNArgBase *)in_RDI[2].super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
      local_18 != (CTPNArgBase *)0x0;
      local_18 = &CTPNArgBase::get_next_arg(local_18)->super_CTPNArgBase) {
    (*(local_18->super_CTcPrsNode).super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0x11])(local_18,in_RSI)
    ;
  }
  return in_RDI;
}

Assistant:

CTcPrsNode *CTPNArglistBase::adjust_for_dyn(const tcpn_dyncomp_info *info)
{
    /* adjust each argument list member */
    CTPNArg *arg;
    for (arg = list_ ; arg != 0 ; arg = arg->get_next_arg())
    {
        /* 
         *   adjust this argument; assume the argument node itself isn't
         *   affected 
         */
        arg->adjust_for_dyn(info);
    }

    /* return myself otherwise unchanged */
    return this;
}